

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float ImGui::CalcItemWidth(void)

{
  float *pfVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  
  if (((GImGui->NextItemData).Flags & 1) == 0) {
    pfVar1 = &(GImGui->CurrentWindow->DC).ItemWidth;
  }
  else {
    pfVar1 = &(GImGui->NextItemData).Width;
  }
  fVar4 = *pfVar1;
  if (fVar4 < 0.0) {
    IVar2 = GetContentRegionAvail();
    fVar3 = fVar4 + IVar2.x;
    fVar4 = 1.0;
    if (1.0 <= fVar3) {
      fVar4 = fVar3;
    }
  }
  return (float)(int)fVar4;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_avail_x = GetContentRegionAvail().x;
        w = ImMax(1.0f, region_avail_x + w);
    }
    w = IM_TRUNC(w);
    return w;
}